

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O2

AccessorType __thiscall
KeyFileReader<NWN::ResRef16>::GetResourceAccessorName
          (KeyFileReader<NWN::ResRef16> *this,FileHandle File,string *AccessorName)

{
  pointer p_Var1;
  int iVar2;
  AccessorType AVar3;
  long lVar4;
  undefined4 extraout_var;
  runtime_error *this_00;
  exception anon_var_0;
  
  if (File == 0) {
    std::__cxx11::string::_M_assign((string *)AccessorName);
    return AccessorTypeKey;
  }
  p_Var1 = (this->m_KeyResDir).
           super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->m_KeyResDir).
                super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var1;
  if ((p_Var1 == (pointer)0x0) || (File = File - 1, (ulong)(lVar4 / 0x28) <= File)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10,File,lVar4 % 0x28);
    std::runtime_error::runtime_error
              (this_00,"invalid file handle passed to KeyFileReader::GetResourceAccessorName");
  }
  else {
    iVar2 = (*((p_Var1[File].BifFile)->super_IResourceAccessor<NWN::ResRef16>).
              _vptr_IResourceAccessor[1])
                      (p_Var1[File].BifFile,(ulong)(p_Var1[File].Res.ResID & 0xfffff));
    lVar4 = CONCAT44(extraout_var,iVar2);
    if (lVar4 != 0) {
      AVar3 = (*((p_Var1[File].BifFile)->super_IResourceAccessor<NWN::ResRef16>).
                _vptr_IResourceAccessor[8])(p_Var1[File].BifFile,lVar4,AccessorName);
      (*((p_Var1[File].BifFile)->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[2])
                (p_Var1[File].BifFile,lVar4);
      return AVar3;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"file open that should not fail has failed");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename KeyFileReader< ResRefT >::AccessorType
KeyFileReader< ResRefT >::GetResourceAccessorName(
	 FileHandle File,
	 std::string & AccessorName
	)
/*++

Routine Description:

	This routine returns the logical name of the resource accessor.

Arguments:

	File - Supplies the file handle to inquire about.

	AccessorName - Receives the logical name of the resource accessor.

Return Value:

	The routine returns the accessor type.  An std::exception is raised on
	failure.

Environment:

	User mode.

--*/
{
	
	PCKEY_RESOURCE_DESCRIPTOR  ResKey;
	typename BifFileReaderT::FileHandle FileHandle;
	AccessorType               Type;

	if (File == INVALID_FILE)
	{
		AccessorName = m_KeyFileName;
		return AccessorTypeKey;
	}

	//
	// Locate the containing BIF file.
	//

	ResKey = LookupResourceKey( ((ResID) File) - 1 );

	if (ResKey == NULL)
		throw std::runtime_error( "invalid file handle passed to KeyFileReader::GetResourceAccessorName" );

	//
	// Now delegate the query to the specific BIF file that has been chosen.
	//
	// N.B.  File open/close for BIF files is a no-op, so we avoid implementing
	//       an extra handle table indirection level here (as it would only
	//       slow things down).  The file open and close calls are essentially
	//       no-ops.
	//

	FileHandle = ResKey->BifFile->OpenFileByIndex(
		ResKey->Res.ResID & 0xFFFFF );

	if (FileHandle == INVALID_FILE)
		throw std::runtime_error( "file open that should not fail has failed" );

	try
	{
		Type = (AccessorType) ResKey->BifFile->GetResourceAccessorName(
			FileHandle,
			AccessorName);
	}
	catch (std::exception)
	{
		ResKey->BifFile->CloseFile( FileHandle );
		FileHandle = INVALID_FILE;
		throw;
	}

	ResKey->BifFile->CloseFile( FileHandle );
	FileHandle = INVALID_FILE;

	return Type;
}